

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

void __thiscall
pbrt::HaltonSampler::HaltonSampler
          (HaltonSampler *this,int samplesPerPixel,Point2i *fullRes,
          RandomizeStrategy randomizeStrategy,int seed,Allocator alloc)

{
  uint uVar1;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *pvVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  int64_t y;
  int64_t x;
  int64_t iStack_28;
  long local_20;
  
  this->samplesPerPixel = samplesPerPixel;
  this->randomizeStrategy = randomizeStrategy;
  this->haltonIndex = 0;
  this->dimension = 0;
  (this->baseExponents).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  this->digitPermutations =
       (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *)
       0x0;
  (this->baseScales).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  if (randomizeStrategy == PermuteDigits) {
    pvVar2 = ComputeRadicalInversePermutations(seed,alloc);
    this->digitPermutations = pvVar2;
  }
  bVar3 = 1;
  do {
    uVar4 = (ulong)(((byte)~bVar3 & 1) << 2);
    iVar7 = *(int *)((long)&(fullRes->super_Tuple2<pbrt::Point2,_int>).x + uVar4);
    iVar6 = 0x80;
    if (iVar7 < 0x80) {
      iVar6 = iVar7;
    }
    if (iVar7 < 2) {
      iVar7 = 0;
      iVar8 = 1;
    }
    else {
      iVar8 = 1;
      iVar7 = 0;
      do {
        iVar8 = iVar8 * (bVar3 ^ 3);
        iVar7 = iVar7 + 1;
      } while (iVar8 < iVar6);
    }
    *(int *)((long)this->multInverse + (uVar4 - 0x10)) = iVar8;
    *(int *)((long)this->multInverse + (uVar4 - 8)) = iVar7;
    bVar9 = bVar3 != 0;
    bVar3 = 0;
  } while (bVar9);
  uVar1 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>.x;
  extendedGCD((long)(this->baseScales).super_Tuple2<pbrt::Point2,_int>.y,(long)(int)uVar1,&local_20,
              &iStack_28);
  lVar5 = local_20 % (long)(int)uVar1;
  this->multInverse[0] = (int)lVar5 + ((uint)(lVar5 >> 0x3f) & uVar1);
  uVar1 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>.y;
  extendedGCD((long)(this->baseScales).super_Tuple2<pbrt::Point2,_int>.x,(long)(int)uVar1,&local_20,
              &iStack_28);
  local_20 = local_20 % (long)(int)uVar1;
  this->multInverse[1] = (int)local_20 + ((uint)(local_20 >> 0x3f) & uVar1);
  return;
}

Assistant:

HaltonSampler::HaltonSampler(int samplesPerPixel, const Point2i &fullRes,
                             RandomizeStrategy randomizeStrategy, int seed,
                             Allocator alloc)
    : samplesPerPixel(samplesPerPixel), randomizeStrategy(randomizeStrategy) {
    if (randomizeStrategy == RandomizeStrategy::PermuteDigits)
        digitPermutations = ComputeRadicalInversePermutations(seed, alloc);
    // Find radical inverse base scales and exponents that cover sampling area
    for (int i = 0; i < 2; ++i) {
        int base = (i == 0) ? 2 : 3;
        int scale = 1, exp = 0;
        while (scale < std::min(fullRes[i], MaxHaltonResolution)) {
            scale *= base;
            ++exp;
        }
        baseScales[i] = scale;
        baseExponents[i] = exp;
    }

    // Compute multiplicative inverses for _baseScales_
    multInverse[0] = multiplicativeInverse(baseScales[1], baseScales[0]);
    multInverse[1] = multiplicativeInverse(baseScales[0], baseScales[1]);
}